

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int jrtplib::GetAutoSockets
              (uint32_t bindIP,bool allowOdd,bool rtcpMux,SocketType *pRtpSock,SocketType *pRtcpSock
              ,uint16_t *pRtpPort,uint16_t *pRtcpPort)

{
  SocketType SVar1;
  int iVar2;
  ushort uVar3;
  size_t i;
  ulong uVar4;
  undefined7 in_register_00000031;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  bool bVar8;
  uint16_t basePort;
  SocketType sock;
  SocketType sock2;
  vector<int,_std::allocator<int>_> toClose;
  sockaddr local_5c;
  undefined4 local_4c;
  SocketType *local_48;
  SocketType *local_40;
  uint16_t *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,allowOdd);
  toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar6 = bindIP >> 0x18 | (bindIP & 0xff0000) >> 8 | (bindIP & 0xff00) << 8 | bindIP << 0x18;
  iVar5 = 0x400;
  local_48 = pRtpSock;
  local_40 = pRtcpSock;
  local_38 = pRtpPort;
LAB_00133960:
  do {
    bVar8 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar8) {
      for (uVar4 = 0;
          uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4]);
      }
      iVar2 = -0xa1;
LAB_00133b0f:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&toClose.super__Vector_base<int,_std::allocator<int>_>);
      return iVar2;
    }
    sock = socket(2,2,0);
    if (sock == -1) {
      for (uVar4 = 0;
          uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4]);
      }
      iVar2 = -0x4b;
      goto LAB_00133b0f;
    }
    local_5c.sa_data[6] = '\0';
    local_5c.sa_data[7] = '\0';
    local_5c.sa_data[8] = '\0';
    local_5c.sa_data[9] = '\0';
    local_5c.sa_data[10] = '\0';
    local_5c.sa_data[0xb] = '\0';
    local_5c.sa_data[0xc] = '\0';
    local_5c.sa_data[0xd] = '\0';
    local_5c.sa_family = 2;
    local_5c.sa_data[0] = '\0';
    local_5c.sa_data[1] = '\0';
    local_5c.sa_data._2_4_ = uVar6;
    iVar2 = bind(sock,&local_5c,0x10);
    if (iVar2 != 0) {
      close(sock);
      for (uVar4 = 0;
          uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4]);
      }
      iVar2 = -0xa0;
      goto LAB_00133b0f;
    }
    basePort = 0;
    iVar2 = GetIPv4SocketPort(sock,&basePort);
    if (iVar2 < 0) {
      close(sock);
      for (uVar4 = 0;
          uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4]);
      }
      goto LAB_00133b0f;
    }
    if (rtcpMux) {
      if (((basePort & 1) == 0) || ((char)local_4c != '\0')) {
        *local_48 = sock;
        *local_40 = sock;
        *local_38 = basePort;
        *pRtcpPort = basePort;
        iVar2 = 0;
        for (uVar4 = 0;
            uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
          close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
        }
        goto LAB_00133b0f;
      }
      std::vector<int,_std::allocator<int>_>::push_back(&toClose,&sock);
      goto LAB_00133960;
    }
    sock2 = socket(2,2,0);
    if (sock2 == -1) {
      close(sock);
      iVar2 = -0x4b;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4]);
      }
      goto LAB_00133b0f;
    }
    if ((basePort & 1) == 0) {
      uVar7 = basePort | 1;
LAB_00133a2f:
      local_5c.sa_data[6] = '\0';
      local_5c.sa_data[7] = '\0';
      local_5c.sa_data[8] = '\0';
      local_5c.sa_data[9] = '\0';
      local_5c.sa_data[10] = '\0';
      local_5c.sa_data[0xb] = '\0';
      local_5c.sa_data[0xc] = '\0';
      local_5c.sa_data[0xd] = '\0';
      local_5c.sa_data._0_2_ = uVar7 << 8 | uVar7 >> 8;
      local_5c.sa_family = 2;
      local_5c.sa_data._2_4_ = uVar6;
      iVar2 = bind(sock2,&local_5c,0x10);
      if (iVar2 == 0) {
        bVar8 = basePort < uVar7;
        uVar3 = uVar7;
        if (bVar8) {
          uVar3 = basePort;
        }
        if (uVar7 < basePort) {
          uVar7 = basePort;
        }
        SVar1 = sock2;
        if (bVar8) {
          SVar1 = sock;
        }
        *local_48 = SVar1;
        SVar1 = sock;
        if (bVar8) {
          SVar1 = sock2;
        }
        *local_40 = SVar1;
        *local_38 = uVar3;
        *pRtcpPort = uVar7;
        iVar2 = 0;
        for (uVar4 = 0;
            uVar4 < (ulong)((long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
          close(toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
        }
        goto LAB_00133b0f;
      }
    }
    else if (1 < basePort) {
      uVar7 = basePort - 1;
      goto LAB_00133a2f;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&toClose,&sock);
    std::vector<int,_std::allocator<int>_>::push_back(&toClose,&sock2);
  } while( true );
}

Assistant:

int GetAutoSockets(uint32_t bindIP, bool allowOdd, bool rtcpMux,
                   SocketType *pRtpSock, SocketType *pRtcpSock, 
                   uint16_t *pRtpPort, uint16_t *pRtcpPort)
{
	const int maxAttempts = 1024;
	int attempts = 0;
	std::vector<SocketType> toClose;

	while (attempts++ < maxAttempts)
	{
		SocketType sock = socket(PF_INET, SOCK_DGRAM, 0);
		if (sock == RTPSOCKERR)
		{
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
		}

		// First we get an automatically chosen port

		struct sockaddr_in addr;
		memset(&addr,0,sizeof(struct sockaddr_in));

		addr.sin_family = AF_INET;
		addr.sin_port = 0;
		addr.sin_addr.s_addr = htonl(bindIP);
		if (bind(sock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTGETVALIDSOCKET;
		}

		uint16_t basePort = 0;
		int status = GetIPv4SocketPort(sock, &basePort);
		if (status < 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return status;
		}

		if (rtcpMux) // only need one socket
		{
			if (basePort%2 == 0 || allowOdd)
			{
				*pRtpSock = sock;
				*pRtcpSock = sock;
				*pRtpPort = basePort;
				*pRtcpPort = basePort;
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);

				return 0;
			}
			else
				toClose.push_back(sock);
		}
		else
		{
			SocketType sock2 = socket(PF_INET, SOCK_DGRAM, 0);
			if (sock2 == RTPSOCKERR)
			{
				RTPCLOSE(sock);
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);
				return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
			}

			// Try the next port or the previous port
			uint16_t secondPort = basePort;
			bool possiblyValid = false;

			if (basePort%2 == 0)
			{
				secondPort++;
				possiblyValid = true;
			}
			else if (basePort > 1) // avoid landing on port 0
			{
				secondPort--;
				possiblyValid = true;
			}

			if (possiblyValid)
			{
				memset(&addr,0,sizeof(struct sockaddr_in));

				addr.sin_family = AF_INET;
				addr.sin_port = htons(secondPort);
				addr.sin_addr.s_addr = htonl(bindIP);
				if (bind(sock2,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) == 0)
				{
					// In this case, we have two consecutive port numbers, the lower of
					// which is even

					if (basePort < secondPort)
					{
						*pRtpSock = sock;
						*pRtcpSock = sock2;
						*pRtpPort = basePort;
						*pRtcpPort = secondPort;
					}
					else
					{
						*pRtpSock = sock2;
						*pRtcpSock = sock;
						*pRtpPort = secondPort;
						*pRtcpPort = basePort;
					}

					for (size_t i = 0 ; i < toClose.size() ; i++)
						RTPCLOSE(toClose[i]);

					return 0;
				}
			}

			toClose.push_back(sock);
			toClose.push_back(sock2);
		}
	}

	for (size_t i = 0 ; i < toClose.size() ; i++)
		RTPCLOSE(toClose[i]);

	return ERR_RTP_UDPV4TRANS_TOOMANYATTEMPTSCHOOSINGSOCKET;
}